

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_fuzz_target_runner.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  size_t size;
  shared_ptr<char> file_buf;
  size_t local_50;
  shared_ptr<char> local_48;
  
  if (1 < argc) {
    uVar2 = 1;
    do {
      local_48.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_48.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_50 = 0;
      QUtil::read_file_into_memory(argv[uVar2],&local_48,&local_50);
      LLVMFuzzerTestOneInput
                ((uchar *)local_48.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 local_50);
      __s = argv[uVar2];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f3280);
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," successful",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      if (local_48.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  return 0;
}

Assistant:

int
main(int argc, char** argv)
{
    for (int i = 1; i < argc; i++) {
        std::shared_ptr<char> file_buf;
        size_t size = 0;
        QUtil::read_file_into_memory(argv[i], file_buf, size);
        LLVMFuzzerTestOneInput(reinterpret_cast<unsigned char*>(file_buf.get()), size);
        std::cout << argv[i] << " successful" << std::endl;
    }
    return 0;
}